

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

ParamNames * __thiscall
vkt::shaderexecutor::
Func<vkt::shaderexecutor::Signature<tcu::Matrix<float,4,2>,tcu::Matrix<float,4,2>,tcu::Matrix<float,4,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
::doGetParamNames_abi_cxx11_
          (Func<vkt::shaderexecutor::Signature<tcu::Matrix<float,4,2>,tcu::Matrix<float,4,2>,tcu::Matrix<float,4,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
           *this)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if (doGetParamNames[abi:cxx11]()::names_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&doGetParamNames[abi:cxx11]()::names_abi_cxx11_);
    if (iVar1 != 0) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"a","");
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"b","");
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"c","");
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"d","");
      Tuple4<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Tuple4(&doGetParamNames[abi:cxx11]()::names_abi_cxx11_,&local_48,&local_68,&local_88,
               &local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      __cxa_atexit(Tuple4<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::~Tuple4,&doGetParamNames[abi:cxx11]()::names_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&doGetParamNames[abi:cxx11]()::names_abi_cxx11_);
    }
  }
  return &doGetParamNames[abi:cxx11]()::names_abi_cxx11_;
}

Assistant:

virtual const ParamNames&	doGetParamNames	(void)							const
	{
		static ParamNames	names	("a", "b", "c", "d");
		return names;
	}